

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BPSerializer.cpp
# Opt level: O0

void __thiscall
adios2::format::BPSerializer::SerializeData(BPSerializer *this,IO *io,bool advanceStep)

{
  byte in_DL;
  undefined8 in_RSI;
  long *in_RDI;
  string *in_stack_00000078;
  IOChrono *in_stack_00000080;
  allocator local_71;
  string local_70 [8];
  string *in_stack_ffffffffffffff98;
  IOChrono *in_stack_ffffffffffffffa0;
  allocator local_39;
  string local_38 [39];
  byte local_11;
  undefined8 local_10;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"buffering",&local_39);
  profiling::IOChrono::Start(in_stack_00000080,in_stack_00000078);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  (**(code **)(*in_RDI + 0x10))(in_RDI,local_10);
  if ((local_11 & 1) != 0) {
    *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) =
         *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) + 1;
    *(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1d8) =
         *(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1d8) + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"buffering",&local_71);
  profiling::IOChrono::Stop(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  return;
}

Assistant:

void BPSerializer::SerializeData(core::IO &io, const bool advanceStep)
{
    m_Profiler.Start("buffering");
    SerializeDataBuffer(io);
    if (advanceStep)
    {
        ++m_MetadataSet.TimeStep;
        ++m_MetadataSet.CurrentStep;
    }
    m_Profiler.Stop("buffering");
}